

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

void Dau_DecMoveFreeToLSB(word *p,int nVars,int *V2P,int *P2V,int maskB,int sizeB)

{
  int local_38;
  int local_34;
  int c;
  int v;
  int sizeB_local;
  int maskB_local;
  int *P2V_local;
  int *V2P_local;
  int nVars_local;
  word *p_local;
  
  local_38 = 0;
  for (local_34 = 0; local_34 < nVars; local_34 = local_34 + 1) {
    if ((maskB >> ((byte)local_34 & 0x1f) & 1U) == 0) {
      Abc_TtMoveVar(p,nVars,V2P,P2V,local_34,local_38);
      local_38 = local_38 + 1;
    }
  }
  if (local_38 == nVars - sizeB) {
    return;
  }
  __assert_fail("c == nVars - sizeB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                ,0x1cc,"void Dau_DecMoveFreeToLSB(word *, int, int *, int *, int, int)");
}

Assistant:

void Dau_DecMoveFreeToLSB( word * p, int nVars, int * V2P, int * P2V, int maskB, int sizeB )
{
    int v, c = 0;
    for ( v = 0; v < nVars; v++ )
        if ( !((maskB >> v) & 1) )
            Abc_TtMoveVar( p, nVars, V2P, P2V, v, c++ );
    assert( c == nVars - sizeB );
}